

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<10,_0,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  VecAccess<float,_4,_3> local_88;
  Matrix<float,_2,_2> local_70;
  Mat2 local_60;
  Vector<float,_3> local_50 [2];
  Matrix<float,_2,_2> local_38;
  Vector<float,_3> local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<0,5>((MatrixCaseUtils *)&local_38,evalCtx,0);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_28,(Mat2 *)&local_38);
  getInputValue<0,5>((MatrixCaseUtils *)&local_70,local_10,0);
  decrement<float,2,2>((MatrixCaseUtils *)&local_60,&local_70);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_50,&local_60);
  tcu::operator+((tcu *)&local_1c,&local_28,local_50);
  tcu::Vector<float,_4>::xyz(&local_88,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_88,&local_1c);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_60);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_70);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_38);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}